

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdrawhelper.cpp
# Opt level: O3

void fetch_linear_gradient(uint32_t *buffer,Operator *op,VSpanData *data,int y,int x,int length)

{
  uint32_t *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  Spread SVar8;
  uint32_t *puVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  bool bVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  
  fVar16 = (op->field_4).linear.l;
  fVar15 = 0.0;
  fVar14 = 0.0;
  if ((fVar16 != 0.0) || (NAN(fVar16))) {
    fVar17 = (float)y + 0.5;
    fVar18 = (float)x + 0.5;
    uVar2 = data->m21;
    uVar5 = data->m22;
    uVar3 = data->m11;
    uVar6 = data->m12;
    uVar4 = data->dx;
    uVar7 = data->dy;
    fVar15 = (float)uVar4 + fVar17 * (float)uVar2 + fVar18 * (float)uVar3;
    fVar14 = (float)uVar7 + fVar17 * (float)uVar5 + fVar18 * (float)uVar6;
    fVar16 = data->m13;
    if ((fVar16 != 0.0) || (((NAN(fVar16) || (data->m23 != 0.0)) || (NAN(data->m23))))) {
      if (length < 1) {
        return;
      }
      puVar1 = buffer + length;
      fVar17 = fVar17 * data->m23 + fVar18 * fVar16 + data->m33;
      SVar8 = (data->mGradient).mSpread;
      puVar9 = (data->mGradient).mColorTable;
      do {
        uVar10 = (uint)(((fVar15 / fVar17) * (op->field_4).linear.dx +
                         (fVar14 / fVar17) * (op->field_4).linear.dy + (op->field_4).linear.off) *
                        1023.0 + 0.5);
        if (SVar8 == Reflect) {
          uVar10 = uVar10 & 0x7ff;
          if (0x3ff < uVar10) {
            uVar10 = uVar10 ^ 0x7ff;
          }
        }
        else if (SVar8 == Repeat) {
          uVar10 = uVar10 & 0x3ff;
        }
        else if ((int)uVar10 < 0) {
          uVar10 = 0;
        }
        else if (0x3fe < uVar10) {
          uVar10 = 0x3ff;
        }
        *buffer = puVar9[uVar10];
        fVar15 = fVar15 + (float)uVar3;
        fVar14 = fVar14 + (float)uVar6;
        fVar17 = fVar17 + fVar16;
        fVar17 = (float)((uint)fVar17 & -(uint)(fVar17 != 0.0) |
                        ~-(uint)(fVar17 != 0.0) & (uint)(fVar16 + fVar17));
        buffer = buffer + 1;
      } while (buffer < puVar1);
      return;
    }
    fVar16 = (op->field_4).linear.dx;
    fVar17 = (op->field_4).linear.dy;
    fVar14 = (fVar15 * fVar16 + fVar14 * fVar17 + (op->field_4).linear.off) * 1023.0;
    fVar15 = (fVar16 * (float)uVar3 + (float)uVar6 * fVar17) * 1023.0;
  }
  if (1e-05 <= ABS(fVar15)) {
    puVar1 = buffer + length;
    fVar16 = (float)length * fVar15 + fVar14;
    if ((4194303.0 <= fVar16) || (fVar16 <= -4194304.0)) {
      if (0 < length) {
        SVar8 = (data->mGradient).mSpread;
        puVar9 = (data->mGradient).mColorTable;
        do {
          uVar10 = (uint)(fVar14 * 0.0009765625 * 1023.0 + 0.5);
          if (SVar8 == Reflect) {
            uVar10 = uVar10 & 0x7ff;
            if (0x3ff < uVar10) {
              uVar10 = uVar10 ^ 0x7ff;
            }
          }
          else if (SVar8 == Repeat) {
            uVar10 = uVar10 & 0x3ff;
          }
          else if ((int)uVar10 < 0) {
            uVar10 = 0;
          }
          else if (0x3fe < uVar10) {
            uVar10 = 0x3ff;
          }
          *buffer = puVar9[uVar10];
          fVar14 = fVar14 + fVar15;
          buffer = buffer + 1;
        } while (buffer < puVar1);
      }
    }
    else if (0 < length) {
      SVar8 = (data->mGradient).mSpread;
      puVar9 = (data->mGradient).mColorTable;
      iVar12 = (int)(fVar14 * 256.0) + 0x80;
      do {
        uVar10 = iVar12 >> 8;
        if (SVar8 == Reflect) {
          uVar10 = uVar10 & 0x7ff;
          if (0x3ff < uVar10) {
            uVar10 = uVar10 ^ 0x7ff;
          }
        }
        else if (SVar8 == Repeat) {
          uVar10 = uVar10 & 0x3ff;
        }
        else if ((int)uVar10 < 0) {
          uVar10 = 0;
        }
        else if (0x3fe < uVar10) {
          uVar10 = 0x3ff;
        }
        *buffer = puVar9[uVar10];
        buffer = buffer + 1;
        iVar12 = iVar12 + (int)(fVar15 * 256.0);
      } while (buffer < puVar1);
    }
    return;
  }
  SVar8 = (data->mGradient).mSpread;
  uVar10 = (int)(fVar14 * 256.0) + 0x80 >> 8;
  if (SVar8 == Reflect) {
    uVar10 = uVar10 & 0x7ff;
    uVar11 = uVar10 ^ 0x7ff;
    bVar13 = uVar10 < 0x400;
  }
  else {
    if (SVar8 == Repeat) {
      uVar10 = uVar10 & 0x3ff;
      goto LAB_0010f06d;
    }
    if ((int)uVar10 < 0) {
      uVar10 = 0;
      goto LAB_0010f06d;
    }
    uVar11 = 0x3ff;
    bVar13 = uVar10 < 0x3ff;
  }
  if (!bVar13) {
    uVar10 = uVar11;
  }
LAB_0010f06d:
  memfill32(buffer,(data->mGradient).mColorTable[uVar10],length);
  return;
}

Assistant:

void fetch_linear_gradient(uint32_t *buffer, const Operator *op,
                           const VSpanData *data, int y, int x, int length)
{
    float                t, inc;
    const VGradientData *gradient = &data->mGradient;

    bool  affine = true;
    float rx = 0, ry = 0;
    if (op->linear.l == 0) {
        t = inc = 0;
    } else {
        rx = data->m21 * (y + float(0.5)) + data->m11 * (x + float(0.5)) +
             data->dx;
        ry = data->m22 * (y + float(0.5)) + data->m12 * (x + float(0.5)) +
             data->dy;
        t = op->linear.dx * rx + op->linear.dy * ry + op->linear.off;
        inc = op->linear.dx * data->m11 + op->linear.dy * data->m12;
        affine = !data->m13 && !data->m23;

        if (affine) {
            t *= (VGradient::colorTableSize - 1);
            inc *= (VGradient::colorTableSize - 1);
        }
    }

    const uint32_t *end = buffer + length;
    if (affine) {
        if (inc > float(-1e-5) && inc < float(1e-5)) {
            memfill32(buffer, gradientPixelFixed(gradient, int(t * FIXPT_SIZE)),
                      length);
        } else {
            if (t + inc * length < float(INT_MAX >> (FIXPT_BITS + 1)) &&
                t + inc * length > float(INT_MIN >> (FIXPT_BITS + 1))) {
                // we can use fixed point math
                int t_fixed = int(t * FIXPT_SIZE);
                int inc_fixed = int(inc * FIXPT_SIZE);
                while (buffer < end) {
                    *buffer = gradientPixelFixed(gradient, t_fixed);
                    t_fixed += inc_fixed;
                    ++buffer;
                }
            } else {
                // we have to fall back to float math
                while (buffer < end) {
                    *buffer =
                        gradientPixel(gradient, t / VGradient::colorTableSize);
                    t += inc;
                    ++buffer;
                }
            }
        }
    } else {  // fall back to float math here as well
        float rw = data->m23 * (y + float(0.5)) + data->m13 * (x + float(0.5)) +
                   data->m33;
        while (buffer < end) {
            float xt = rx / rw;
            float yt = ry / rw;
            t = (op->linear.dx * xt + op->linear.dy * yt) + op->linear.off;

            *buffer = gradientPixel(gradient, t);
            rx += data->m11;
            ry += data->m12;
            rw += data->m13;
            if (!rw) {
                rw += data->m13;
            }
            ++buffer;
        }
    }
}